

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5Loader.cpp
# Opt level: O2

void __thiscall Assimp::MD5Importer::LoadMD5CameraFile(MD5Importer *this)

{
  undefined8 *puVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  uint uVar2;
  uint uVar3;
  IOSystem *pIVar4;
  aiScene *paVar5;
  pointer puVar6;
  int iVar7;
  ai_uint32 aVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  aiNode *this_01;
  aiNode **ppaVar9;
  aiNode *this_02;
  aiCamera **ppaVar10;
  aiCamera *this_03;
  long lVar11;
  aiAnimation **ppaVar12;
  aiAnimation *this_04;
  aiNodeAnim **ppaVar13;
  aiNodeAnim *this_05;
  aiVectorKey *paVar14;
  aiQuatKey *paVar15;
  DeadlyImportError *pDVar16;
  aiQuatKey *paVar17;
  pointer puVar18;
  uint *puVar19;
  ulong uVar20;
  uint uVar21;
  uint i;
  allocator<char> local_e1;
  IOStream *local_e0;
  string local_d8;
  MD5CameraParser cameraParser;
  string pFile;
  MD5Parser parser;
  IOStream *file;
  ulong uVar22;
  
  std::operator+(&pFile,&this->mFile,"md5camera");
  pIVar4 = this->pIOHandler;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cameraParser,"rb",(allocator<char> *)&parser);
  iVar7 = (*pIVar4->_vptr_IOSystem[4])
                    (pIVar4,pFile._M_dataplus._M_p,
                     CONCAT44(cameraParser._4_4_,cameraParser.fFrameRate));
  file = (IOStream *)CONCAT44(extraout_var,iVar7);
  std::__cxx11::string::~string((string *)&cameraParser);
  local_e0 = file;
  if ((file != (IOStream *)0x0) &&
     (iVar7 = (*file->_vptr_IOStream[6])(file), CONCAT44(extraout_var_00,iVar7) != 0)) {
    this->bHadMD5Camera = true;
    LoadFileIntoMemory(this,file);
    MD5::MD5Parser::MD5Parser(&parser,this->mBuffer,this->fileSize);
    MD5::MD5CameraParser::MD5CameraParser(&cameraParser,&parser.mSections);
    if (cameraParser.frames.
        super__Vector_base<Assimp::MD5::CameraAnimFrameDesc,_std::allocator<Assimp::MD5::CameraAnimFrameDesc>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        cameraParser.frames.
        super__Vector_base<Assimp::MD5::CameraAnimFrameDesc,_std::allocator<Assimp::MD5::CameraAnimFrameDesc>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pDVar16 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d8,"MD5CAMERA: No frames parsed",&local_e1);
      DeadlyImportError::DeadlyImportError(pDVar16,&local_d8);
      __cxa_throw(pDVar16,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    this_01 = (aiNode *)operator_new(0x478);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"<MD5CameraRoot>",&local_e1);
    aiNode::aiNode(this_01,&local_d8);
    this->pScene->mRootNode = this_01;
    std::__cxx11::string::~string((string *)&local_d8);
    this_01->mNumChildren = 1;
    ppaVar9 = (aiNode **)operator_new__(8);
    this_01->mChildren = ppaVar9;
    this_02 = (aiNode *)operator_new(0x478);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"<MD5Camera>",&local_e1);
    aiNode::aiNode(this_02,&local_d8);
    *this_01->mChildren = this_02;
    std::__cxx11::string::~string((string *)&local_d8);
    (*this_01->mChildren)->mParent = this_01;
    this->pScene->mNumCameras = 1;
    ppaVar10 = (aiCamera **)operator_new__(8);
    this->pScene->mCameras = ppaVar10;
    this_03 = (aiCamera *)operator_new(0x438);
    this_00 = &cameraParser.cuts;
    aiCamera::aiCamera(this_03);
    *this->pScene->mCameras = this_03;
    aiString::Set((aiString *)this_03,"<MD5Camera>");
    this_03->mHorizontalFOV =
         (cameraParser.frames.
          super__Vector_base<Assimp::MD5::CameraAnimFrameDesc,_std::allocator<Assimp::MD5::CameraAnimFrameDesc>_>
          ._M_impl.super__Vector_impl_data._M_start)->fFOV * 0.017453292;
    if (cameraParser.cuts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        cameraParser.cuts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_d8._M_dataplus._M_p._0_4_ = 0;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                (this_00,(uint *)&local_d8);
      local_d8._M_dataplus._M_p._0_4_ =
           (int)(((long)cameraParser.frames.
                        super__Vector_base<Assimp::MD5::CameraAnimFrameDesc,_std::allocator<Assimp::MD5::CameraAnimFrameDesc>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)cameraParser.frames.
                       super__Vector_base<Assimp::MD5::CameraAnimFrameDesc,_std::allocator<Assimp::MD5::CameraAnimFrameDesc>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x1c) + -1;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                (this_00,(uint *)&local_d8);
    }
    else {
      local_d8._M_dataplus._M_p._0_4_ = 0;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_insert_rval
                (this_00,(const_iterator)
                         cameraParser.cuts.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start,(value_type_conflict4 *)&local_d8);
      lVar11 = ((long)cameraParser.frames.
                      super__Vector_base<Assimp::MD5::CameraAnimFrameDesc,_std::allocator<Assimp::MD5::CameraAnimFrameDesc>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)cameraParser.frames.
                     super__Vector_base<Assimp::MD5::CameraAnimFrameDesc,_std::allocator<Assimp::MD5::CameraAnimFrameDesc>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x1c;
      if ((ulong)cameraParser.cuts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish[-1] < lVar11 - 1U) {
        local_d8._M_dataplus._M_p._0_4_ = (int)lVar11 + -1;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (this_00,(uint *)&local_d8);
      }
    }
    puVar18 = cameraParser.cuts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    puVar6 = cameraParser.cuts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    this->pScene->mNumAnimations =
         (int)((ulong)((long)cameraParser.cuts.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish -
                      (long)cameraParser.cuts.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start) >> 2) - 1;
    paVar5 = this->pScene;
    ppaVar12 = (aiAnimation **)operator_new__((ulong)paVar5->mNumAnimations << 3);
    paVar5->mAnimations = ppaVar12;
    while (puVar19 = puVar6, puVar19 != puVar18 + -1) {
      this_04 = (aiAnimation *)operator_new(0x448);
      aiAnimation::aiAnimation(this_04);
      *ppaVar12 = this_04;
      aVar8 = snprintf((this_04->mName).data,0x400,"anim%u_from_%u_to_%u",
                       (ulong)((long)puVar19 -
                              (long)cameraParser.cuts.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start) >> 2,(ulong)*puVar19,
                       (ulong)puVar19[1]);
      (this_04->mName).length = aVar8;
      this_04->mTicksPerSecond = (double)cameraParser.fFrameRate;
      this_04->mNumChannels = 1;
      ppaVar13 = (aiNodeAnim **)operator_new__(8);
      this_04->mChannels = ppaVar13;
      this_05 = (aiNodeAnim *)operator_new(0x438);
      (this_05->mNodeName).length = 0;
      (this_05->mNodeName).data[0] = '\0';
      memset((this_05->mNodeName).data + 1,0x1b,0x3ff);
      this_05->mRotationKeys = (aiQuatKey *)0x0;
      this_05->mNumScalingKeys = 0;
      *(undefined8 *)&this_05->mNumPositionKeys = 0;
      *(undefined8 *)((long)&this_05->mPositionKeys + 4) = 0;
      this_05->mScalingKeys = (aiVectorKey *)0x0;
      this_05->mPreState = aiAnimBehaviour_DEFAULT;
      this_05->mPostState = aiAnimBehaviour_DEFAULT;
      *ppaVar13 = this_05;
      aiString::Set((aiString *)this_05,"<MD5Camera>");
      uVar2 = *puVar19;
      uVar3 = puVar19[1];
      uVar21 = uVar3 - uVar2;
      uVar22 = (ulong)uVar21;
      this_05->mNumRotationKeys = uVar21;
      this_05->mNumPositionKeys = uVar21;
      uVar20 = uVar22 * 0x18;
      paVar14 = (aiVectorKey *)operator_new__(uVar20);
      if (uVar3 != uVar2) {
        lVar11 = 0;
        do {
          *(undefined4 *)((long)&(paVar14->mValue).z + lVar11) = 0;
          puVar1 = (undefined8 *)((long)&paVar14->mTime + lVar11);
          *puVar1 = 0;
          puVar1[1] = 0;
          lVar11 = lVar11 + 0x18;
        } while (uVar20 - lVar11 != 0);
      }
      this_05->mPositionKeys = paVar14;
      paVar15 = (aiQuatKey *)operator_new__(uVar20);
      if (uVar21 != 0) {
        paVar17 = paVar15;
        do {
          paVar17->mTime = 0.0;
          (paVar17->mValue).w = 1.0;
          (paVar17->mValue).x = 0.0;
          (paVar17->mValue).y = 0.0;
          (paVar17->mValue).z = 0.0;
          paVar17 = paVar17 + 1;
        } while (paVar17 != paVar15 + uVar22);
      }
      ppaVar12 = ppaVar12 + 1;
      this_05->mRotationKeys = paVar15;
      lVar11 = 8;
      for (uVar20 = 0;
          puVar18 = cameraParser.cuts.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish, puVar6 = puVar19 + 1, file = local_e0,
          uVar20 < uVar22; uVar20 = uVar20 + 1) {
        uVar2 = *puVar19;
        iVar7 = (int)uVar20;
        paVar14 = this_05->mPositionKeys;
        *(float *)((long)&(paVar14->mValue).x + lVar11) =
             cameraParser.frames.
             super__Vector_base<Assimp::MD5::CameraAnimFrameDesc,_std::allocator<Assimp::MD5::CameraAnimFrameDesc>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar2 + iVar7].super_BaseFrameDesc.
             vPositionXYZ.z;
        *(undefined8 *)((long)&paVar14->mTime + lVar11) =
             *(undefined8 *)
              &cameraParser.frames.
               super__Vector_base<Assimp::MD5::CameraAnimFrameDesc,_std::allocator<Assimp::MD5::CameraAnimFrameDesc>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar2 + iVar7].super_BaseFrameDesc.
               vPositionXYZ;
        MD5::ConvertQuaternion
                  (&cameraParser.frames.
                    super__Vector_base<Assimp::MD5::CameraAnimFrameDesc,_std::allocator<Assimp::MD5::CameraAnimFrameDesc>_>
                    ._M_impl.super__Vector_impl_data._M_start[*puVar19 + iVar7].super_BaseFrameDesc.
                    vRotationQuat,(aiQuaternion *)((long)&this_05->mRotationKeys->mTime + lVar11));
        uVar2 = *puVar19;
        *(double *)((long)this_05->mPositionKeys + lVar11 + -8) = (double)(uVar2 + iVar7);
        *(double *)((long)this_05->mRotationKeys + lVar11 + -8) = (double)(uVar2 + iVar7);
        uVar22 = (ulong)this_05->mNumPositionKeys;
        lVar11 = lVar11 + 0x18;
      }
    }
    MD5::MD5CameraParser::~MD5CameraParser(&cameraParser);
    std::vector<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>::~vector
              (&parser.mSections);
    (*file->_vptr_IOStream[1])(file);
    std::__cxx11::string::~string((string *)&pFile);
    return;
  }
  pDVar16 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cameraParser,
                 "Failed to read MD5CAMERA file: ",&pFile);
  DeadlyImportError::DeadlyImportError(pDVar16,(string *)&cameraParser);
  __cxa_throw(pDVar16,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void MD5Importer::LoadMD5CameraFile ()
{
    std::string pFile = mFile + "md5camera";
    std::unique_ptr<IOStream> file( pIOHandler->Open( pFile, "rb"));

    // Check whether we can read from the file
    if( !file.get() || !file->FileSize())   {
        throw DeadlyImportError("Failed to read MD5CAMERA file: " + pFile);
    }
    bHadMD5Camera = true;
    LoadFileIntoMemory(file.get());

    // parse the basic file structure
    MD5::MD5Parser parser(mBuffer,fileSize);

    // load the camera animation data from the parse tree
    MD5::MD5CameraParser cameraParser(parser.mSections);

    if (cameraParser.frames.empty()) {
        throw DeadlyImportError("MD5CAMERA: No frames parsed");
    }

    std::vector<unsigned int>& cuts = cameraParser.cuts;
    std::vector<MD5::CameraAnimFrameDesc>& frames = cameraParser.frames;

    // Construct output graph - a simple root with a dummy child.
    // The root node performs the coordinate system conversion
    aiNode* root = pScene->mRootNode = new aiNode("<MD5CameraRoot>");
    root->mChildren = new aiNode*[root->mNumChildren = 1];
    root->mChildren[0] = new aiNode("<MD5Camera>");
    root->mChildren[0]->mParent = root;

    // ... but with one camera assigned to it
    pScene->mCameras = new aiCamera*[pScene->mNumCameras = 1];
    aiCamera* cam = pScene->mCameras[0] = new aiCamera();
    cam->mName = "<MD5Camera>";

    // FIXME: Fov is currently set to the first frame's value
    cam->mHorizontalFOV = AI_DEG_TO_RAD( frames.front().fFOV );

    // every cut is written to a separate aiAnimation
    if (!cuts.size()) {
        cuts.push_back(0);
        cuts.push_back(static_cast<unsigned int>(frames.size()-1));
    }
    else {
        cuts.insert(cuts.begin(),0);

        if (cuts.back() < frames.size()-1)
            cuts.push_back(static_cast<unsigned int>(frames.size()-1));
    }

    pScene->mNumAnimations = static_cast<unsigned int>(cuts.size()-1);
    aiAnimation** tmp = pScene->mAnimations = new aiAnimation*[pScene->mNumAnimations];
    for (std::vector<unsigned int>::const_iterator it = cuts.begin(); it != cuts.end()-1; ++it) {

        aiAnimation* anim = *tmp++ = new aiAnimation();
        anim->mName.length = ::ai_snprintf(anim->mName.data, MAXLEN, "anim%u_from_%u_to_%u",(unsigned int)(it-cuts.begin()),(*it),*(it+1));

        anim->mTicksPerSecond = cameraParser.fFrameRate;
        anim->mChannels = new aiNodeAnim*[anim->mNumChannels = 1];
        aiNodeAnim* nd  = anim->mChannels[0] = new aiNodeAnim();
        nd->mNodeName.Set("<MD5Camera>");

        nd->mNumPositionKeys = nd->mNumRotationKeys = *(it+1) - (*it);
        nd->mPositionKeys = new aiVectorKey[nd->mNumPositionKeys];
        nd->mRotationKeys = new aiQuatKey  [nd->mNumRotationKeys];
        for (unsigned int i = 0; i < nd->mNumPositionKeys; ++i) {

            nd->mPositionKeys[i].mValue = frames[*it+i].vPositionXYZ;
            MD5::ConvertQuaternion(frames[*it+i].vRotationQuat,nd->mRotationKeys[i].mValue);
            nd->mRotationKeys[i].mTime = nd->mPositionKeys[i].mTime = *it+i;
        }
    }
}